

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_if_stmt(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  bool bVar1;
  LabelId LVar2;
  LabelId bbFalse;
  SharedExNdPtr cond;
  RightVal right;
  string tmpName;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->irGenerator;
  LVar2 = irGenerator::irGenerator::getNewLabelId(this_00);
  bbFalse = irGenerator::irGenerator::getNewLabelId(this_00);
  condStr.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  match_one_word(this,IFTK);
  match_one_word(this,LPARENT);
  gm_cond((SyntaxAnalyze *)&right);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&right);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&right.
                     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> + 8))
  ;
  match_one_word(this,RPARENT);
  if ((cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type == CNS) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&tmpName,this_00,Int);
    right.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
    _M_storage = (_Uninitialized<int,_true>)0;
    right.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,int,std::__cxx11::string> *)&right,
               &(cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_value);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_70,&tmpName);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_98,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&right);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_70,(RightVal *)&local_98);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_98);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_70);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&condStr,&tmpName);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&right);
    std::__cxx11::string::~string((string *)&tmpName);
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&condStr,
               &(cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name);
  }
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_c0,
                   &condStr.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,LVar2,bbFalse,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c0,Branch);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_c0);
  irGenerator::irGenerator::ir_label(this_00,LVar2);
  gm_stmt(this);
  bVar1 = try_word(this,1,ELSETK);
  if (bVar1) {
    LVar2 = irGenerator::irGenerator::getNewLabelId(this_00);
    local_48._M_engaged = false;
    irGenerator::irGenerator::ir_jump
              (this_00,Br,LVar2,-1,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_48,Branch);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_48);
    irGenerator::irGenerator::ir_label(this_00,bbFalse);
    match_one_word(this,ELSETK);
    gm_stmt(this);
    irGenerator::irGenerator::ir_label(this_00,LVar2);
  }
  else {
    irGenerator::irGenerator::ir_label(this_00,bbFalse);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&condStr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cond.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void SyntaxAnalyze::gm_if_stmt() {
  SharedExNdPtr cond;
  LabelId ifTrue = irGenerator.getNewLabelId();
  LabelId ifFalse = irGenerator.getNewLabelId();
  std::optional<string> condStr;

  match_one_word(Token::IFTK);

  match_one_word(Token::LPARENT);

  cond = gm_cond();

  match_one_word(Token::RPARENT);

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, ifTrue, ifFalse,
                      condStr, mir::inst::JumpKind::Branch);
  irGenerator.ir_label(ifTrue);

  gm_stmt();

  if (try_word(1, Token::ELSETK)) {
    LabelId ifEnd = irGenerator.getNewLabelId();
    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br, ifEnd, -1,
                        std::nullopt, mir::inst::JumpKind::Branch);
    irGenerator.ir_label(ifFalse);

    match_one_word(Token::ELSETK);
    gm_stmt();

    irGenerator.ir_label(ifEnd);
  } else {
    irGenerator.ir_label(ifFalse);
  }
}